

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O2

void __thiscall
WaitableSafeQueue<WriterData>::WaitableSafeQueue
          (WaitableSafeQueue<WriterData> *this,uint32_t maxSize)

{
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>._vptr_SafeQueue =
       (_func_int **)&PTR__WaitableSafeQueue_0024a038;
  SafeQueueWithNotification<WriterData>::SafeQueueWithNotification
            (&this->super_SafeQueueWithNotification<WriterData>,maxSize,&this->m_mtx,&this->m_cond);
  (this->super_SafeQueueWithNotification<WriterData>).super_SafeQueue<WriterData>._vptr_SafeQueue =
       (_func_int **)&PTR__WaitableSafeQueue_0024a038;
  (this->m_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->m_cond);
  return;
}

Assistant:

WaitableSafeQueue(const uint32_t maxSize) : SafeQueueWithNotification<T>(maxSize, m_mtx, m_cond) {}